

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessVertexShaderArguments
          (ConversionStream *this,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *GlobalVariables,stringstream *ReturnHandlerSS,String *Prologue)

{
  String *pSVar1;
  ulong uVar2;
  StorageQualifier SVar3;
  ShaderParameterInfo *pSVar4;
  pointer pSVar5;
  HLSL2GLSLConverterImpl *pHVar6;
  size_type sVar7;
  __node_base_ptr p_Var8;
  mapped_type pcVar9;
  long lVar10;
  ConversionStream *this_00;
  size_t sVar11;
  ostream *poVar12;
  __node_base_ptr p_Var13;
  char *pcVar14;
  long lVar15;
  __node_base_ptr p_Var16;
  _Hash_node_base *p_Var17;
  mapped_type *ppcVar18;
  ulong uVar19;
  ConversionStream *pCVar20;
  ulong uVar21;
  int location;
  char *pcVar22;
  __node_base_ptr p_Var23;
  pointer pSVar24;
  bool bVar25;
  string msg;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  MemberStack;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack;
  int InputLocation;
  char *EndPtr;
  String GLSLVariable;
  unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  LocationToSemantic;
  stringstream PrologueSS;
  stringstream GlobalVarsSS;
  stringstream InterfaceVarsSS;
  undefined1 local_5d8 [32];
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  local_5b8;
  void *local_598;
  iterator iStack_590;
  __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
  *local_588;
  undefined1 local_578 [16];
  _List_node_base *local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  int local_54c;
  char *local_548;
  __node_base local_540;
  char local_538;
  undefined7 uStack_537;
  stringstream *local_528;
  ConversionStream *local_520;
  String *local_518;
  String *local_510;
  __node_base local_508;
  _Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_500;
  stringstream local_4c8 [16];
  _Alloc_hider local_4b8 [14];
  ios_base aiStack_448 [264];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [128];
  ios_base aiStack_138 [264];
  
  local_528 = ReturnHandlerSS;
  local_510 = GlobalVariables;
  std::__cxx11::stringstream::stringstream(local_340);
  std::__cxx11::stringstream::stringstream(local_4c8);
  local_520 = this;
  local_518 = Prologue;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_500._M_buckets = &local_500._M_single_bucket;
  local_500._M_bucket_count = 1;
  local_500._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_500._M_element_count = 0;
  local_500._M_rehash_policy._M_max_load_factor = 1.0;
  local_500._M_rehash_policy._M_next_resize = 0;
  local_500._M_single_bucket = (__node_base_ptr)0x0;
  pSVar24 = (Params->
            super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_508._M_nxt =
       (_Hash_node_base *)
       (Params->
       super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar24 != (pointer)local_508._M_nxt) {
    local_528 = local_528 + 0x10;
    local_578._4_4_ = 0;
    local_54c = 0;
    do {
      SVar3 = pSVar24->storageQualifier;
      if ((SVar3 == Ret) || (SVar3 == Out)) {
        local_5b8.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (ShaderParameterInfo **)0x0;
        local_5b8.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (ShaderParameterInfo **)0x0;
        local_5b8.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (ShaderParameterInfo **)0x0;
        local_588 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                     *)0x0;
        local_598 = (void *)0x0;
        iStack_590._M_current =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_5d8._0_8_ = pSVar24;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)&local_5b8,(iterator)0x0,(ShaderParameterInfo **)local_5d8);
        local_5d8._0_8_ =
             (pSVar24->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (iStack_590._M_current == local_588) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_598,iStack_590,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_5d8);
        }
        else {
          (iStack_590._M_current)->_M_current = (ShaderParameterInfo *)local_5d8._0_8_;
          iStack_590._M_current = iStack_590._M_current + 1;
        }
        if (((pSVar24->storageQualifier != Ret) && ((pSVar24->GSAttribs).PrimType == Undefined)) &&
           ((pSVar24->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"    ",4);
          pcVar22 = (pSVar24->Type)._M_dataplus._M_p;
          if (pcVar22 == (char *)0x0) {
            std::ios::clear((int)local_4b8 + (int)*(undefined8 *)(local_4b8[0]._M_p + -0x18));
          }
          else {
            sVar11 = strlen(pcVar22);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,pcVar22,sVar11);
          }
          local_5d8[0] = (string)0x20;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4b8,(char *)local_5d8,1);
          pcVar22 = (pSVar24->Name)._M_dataplus._M_p;
          if (pcVar22 == (char *)0x0) {
            std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
          }
          else {
            sVar11 = strlen(pcVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar22,sVar11);
          }
          if ((pSVar24->ArraySize)._M_string_length != 0) {
            local_5d8[0] = (string)0x5b;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4b8,(char *)local_5d8,1);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(pSVar24->ArraySize)._M_dataplus._M_p,
                                 (pSVar24->ArraySize)._M_string_length);
            local_5d8[0] = (string)0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_5d8,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,";\n",2);
        }
        while (local_5b8.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_5b8.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
          pSVar4 = local_5b8.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
          pSVar5 = (pSVar4->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((pSVar4->members).
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              ._M_impl.super__Vector_impl_data._M_start == pSVar5) {
            if (iStack_590._M_current[-1]._M_current != pSVar5) {
              FormatString<char[26],char[49]>
                        ((string *)local_5d8,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                         (char (*) [49])iStack_590._M_current);
              DebugAssertionFailed
                        ((Char *)local_5d8._0_8_,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb19);
              if ((pointer)local_5d8._0_8_ != (pointer)(local_5d8 + 0x10)) {
                operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
              }
            }
            if ((pSVar4->Semantic)._M_string_length == 0) {
              LogError<true,char[36],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar4->Name,
                         (char (*) [2])0x70aecf);
            }
            local_540._M_nxt = (_Hash_node_base *)0x0;
            local_538 = '\0';
            pHVar6 = local_520->m_Converter;
            local_548 = &local_538;
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)local_5d8,(pSVar4->Semantic)._M_dataplus._M_p,false);
            pCVar20 = (ConversionStream *)
                      ((local_5d8._8_8_ & 0x7fffffffffffffff) %
                      (pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[0]._M_elems[1]._M_h._M_bucket_count
                      );
            p_Var13 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_before_node
                                (&(pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[0]._M_elems[1]._M_h,
                                 (size_type)pCVar20,(key_type *)local_5d8,
                                 local_5d8._8_8_ & 0x7fffffffffffffff);
            if (p_Var13 == (__node_base_ptr)0x0) {
              p_Var17 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var17 = p_Var13->_M_nxt;
            }
            if (((pointer)local_5d8._0_8_ != (pointer)0x0) && ((long)local_5d8._8_8_ < 0)) {
              operator_delete__((void *)local_5d8._0_8_);
            }
            if (p_Var17 != (_Hash_node_base *)0x0) {
              pCVar20 = (ConversionStream *)(p_Var17 + 3);
              std::__cxx11::string::_M_assign((string *)&local_548);
            }
            pcVar22 = "";
            if (pSVar4->storageQualifier == Ret) {
              pcVar22 = "_RET_VAL_";
            }
            BuildParameterName_abi_cxx11_((string *)local_5d8,pCVar20,&local_5b8,'.',"",pcVar22,"");
            this_00 = local_520;
            if (local_540._M_nxt == (_Hash_node_base *)0x0) {
              pcVar22 = "_";
              if (local_520->m_bUseInOutLocationQualifiers != false) {
                pcVar22 = "_vsout_";
              }
              BuildParameterName_abi_cxx11_
                        ((String *)(local_578 + 8),pCVar20,&local_5b8,'_',pcVar22,"","");
              bVar25 = this_00->m_bUseInOutLocationQualifiers;
              pcVar22 = GetInterpolationQualifier(this_00,pSVar4);
              location = -1;
              if (bVar25 != false) {
                location = local_54c;
              }
              DefineInterfaceVar(location,pcVar22,"out",&pSVar4->Type,(String *)(local_578 + 8),
                                 (stringstream *)local_1b8);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_528,(char *)local_578._8_8_,(long)local_568);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," = ",3);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_5d8._0_8_,local_5d8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,";\\\n",3);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_578._8_8_ != &local_560) {
                operator_delete((void *)local_578._8_8_,local_560._M_allocated_capacity + 1);
              }
              local_54c = local_54c + (uint)bVar25;
            }
            else {
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_528,local_548,(long)local_540._M_nxt);
              local_578[8] = 0x28;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_578 + 8,1);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_5d8._0_8_,local_5d8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,");\\\n",4);
            }
            if ((pointer)local_5d8._0_8_ != (pointer)(local_5d8 + 0x10)) {
              operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
            }
            local_5b8.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_5b8.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            iStack_590._M_current = iStack_590._M_current + -1;
            if (local_548 != &local_538) {
              operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
            }
          }
          else {
            if ((pSVar4->Semantic)._M_string_length != 0) {
              LogError<true,char[35],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar4->Name,
                         (char (*) [2])0x70aecf);
            }
            pSVar5 = iStack_590._M_current[-1]._M_current;
            if (pSVar5 == (pSVar4->members).
                          super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              local_5b8.
              super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_5b8.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              iStack_590._M_current = iStack_590._M_current + -1;
            }
            else {
              iStack_590._M_current[-1]._M_current = pSVar5 + 1;
              if (local_5b8.
                  super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_5b8.
                  super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_5d8._0_8_ = pSVar5;
                std::
                vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                ::
                _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                          ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                            *)&local_5b8,
                           (iterator)
                           local_5b8.
                           super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (ShaderParameterInfo **)local_5d8);
              }
              else {
                *local_5b8.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = pSVar5;
                local_5b8.
                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_5b8.
                     super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              local_5d8._0_8_ =
                   (pSVar5->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (iStack_590._M_current == local_588) {
                std::
                vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                ::
                _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                          ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                            *)&local_598,iStack_590,
                           (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                            *)local_5d8);
              }
              else {
                (iStack_590._M_current)->_M_current = (ShaderParameterInfo *)local_5d8._0_8_;
                iStack_590._M_current = iStack_590._M_current + 1;
              }
            }
          }
        }
LAB_002d60fd:
        if (local_598 != (void *)0x0) {
          operator_delete(local_598,(long)local_588 - (long)local_598);
        }
        if (local_5b8.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (ShaderParameterInfo **)0x0) {
          operator_delete(local_5b8.
                          super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_5b8.
                                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_5b8.
                                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else if (SVar3 == In) {
        local_5b8.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (ShaderParameterInfo **)0x0;
        local_5b8.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (ShaderParameterInfo **)0x0;
        local_5b8.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (ShaderParameterInfo **)0x0;
        local_588 = (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                     *)0x0;
        local_598 = (void *)0x0;
        iStack_590._M_current =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_5d8._0_8_ = pSVar24;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)&local_5b8,(iterator)0x0,(ShaderParameterInfo **)local_5d8);
        local_5d8._0_8_ =
             (pSVar24->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (iStack_590._M_current == local_588) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_598,iStack_590,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_5d8);
        }
        else {
          (iStack_590._M_current)->_M_current = (ShaderParameterInfo *)local_5d8._0_8_;
          iStack_590._M_current = iStack_590._M_current + 1;
        }
        if (((pSVar24->storageQualifier != Ret) && ((pSVar24->GSAttribs).PrimType == Undefined)) &&
           ((pSVar24->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"    ",4);
          pcVar22 = (pSVar24->Type)._M_dataplus._M_p;
          if (pcVar22 == (char *)0x0) {
            std::ios::clear((int)local_4b8 + (int)*(undefined8 *)(local_4b8[0]._M_p + -0x18));
          }
          else {
            sVar11 = strlen(pcVar22);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,pcVar22,sVar11);
          }
          local_5d8[0] = (string)0x20;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4b8,(char *)local_5d8,1);
          pcVar22 = (pSVar24->Name)._M_dataplus._M_p;
          if (pcVar22 == (char *)0x0) {
            std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
          }
          else {
            sVar11 = strlen(pcVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar22,sVar11);
          }
          if ((pSVar24->ArraySize)._M_string_length != 0) {
            local_5d8[0] = (string)0x5b;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4b8,(char *)local_5d8,1);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(pSVar24->ArraySize)._M_dataplus._M_p,
                                 (pSVar24->ArraySize)._M_string_length);
            local_5d8[0] = (string)0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_5d8,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,";\n",2);
        }
        while (local_5b8.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_5b8.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
          pSVar4 = local_5b8.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
          pSVar5 = (pSVar4->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((pSVar4->members).
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              ._M_impl.super__Vector_impl_data._M_start == pSVar5) {
            if (iStack_590._M_current[-1]._M_current != pSVar5) {
              FormatString<char[26],char[49]>
                        ((string *)local_5d8,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                         (char (*) [49])iStack_590._M_current);
              DebugAssertionFailed
                        ((Char *)local_5d8._0_8_,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb19);
              if ((pointer)local_5d8._0_8_ != (pointer)(local_5d8 + 0x10)) {
                operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
              }
            }
            if ((pSVar4->Semantic)._M_string_length == 0) {
              LogError<true,char[36],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar4->Name,
                         (char (*) [2])0x70aecf);
            }
            pSVar1 = &pSVar4->Semantic;
            local_540._M_nxt = (_Hash_node_base *)0x0;
            local_538 = '\0';
            pHVar6 = local_520->m_Converter;
            local_548 = &local_538;
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)local_5d8,(pSVar1->_M_dataplus)._M_p,false);
            pCVar20 = (ConversionStream *)
                      ((local_5d8._8_8_ & 0x7fffffffffffffff) %
                      (pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[0]._M_elems[0]._M_h._M_bucket_count
                      );
            p_Var13 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_before_node
                                ((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                  *)&pHVar6->m_HLSLSemanticToGLSLVar,(size_type)pCVar20,
                                 (key_type *)local_5d8,local_5d8._8_8_ & 0x7fffffffffffffff);
            if (p_Var13 == (__node_base_ptr)0x0) {
              p_Var17 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var17 = p_Var13->_M_nxt;
            }
            if (((pointer)local_5d8._0_8_ != (pointer)0x0) && ((long)local_5d8._8_8_ < 0)) {
              operator_delete__((void *)local_5d8._0_8_);
            }
            if (p_Var17 != (_Hash_node_base *)0x0) {
              pCVar20 = (ConversionStream *)(p_Var17 + 3);
              std::__cxx11::string::_M_assign((string *)&local_548);
            }
            BuildParameterName_abi_cxx11_((string *)local_5d8,pCVar20,&local_5b8,'.',"","","");
            if (local_540._M_nxt == (_Hash_node_base *)0x0) {
              local_578._0_4_ = local_578._4_4_;
              pcVar22 = (pSVar4->Semantic)._M_dataplus._M_p;
              sVar7 = (pSVar4->Semantic)._M_string_length;
              if (sVar7 == 0) {
                bVar25 = false;
              }
              else {
                if (*pcVar22 == 'a') {
                  uVar19 = sVar7 - 1;
                  if (4 < uVar19) {
                    uVar19 = 5;
                  }
                  uVar21 = 0;
                  do {
                    lVar15 = uVar21 + 1;
                    uVar2 = uVar19 + 1;
                    if (uVar19 == uVar21) break;
                    uVar2 = uVar21 + 1;
                    lVar10 = uVar21 + 1;
                    uVar21 = uVar2;
                  } while ("attrib"[lVar15] == pcVar22[lVar10]);
                  bVar25 = "attrib"[lVar15] == '\0';
                  pcVar14 = pcVar22 + uVar2;
                }
                else {
                  bVar25 = false;
                  pcVar14 = pcVar22;
                }
                if (bVar25) {
                  pcVar22 = pcVar14;
                }
              }
              if (bVar25) {
                local_578._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                lVar15 = strtol(pcVar22,(char **)(local_578 + 8),10);
                if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_578._8_8_ !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0) && (*(char *)local_578._8_8_ == '\0')) {
                  local_578._0_4_ = (undefined4)lVar15;
                  local_578._4_4_ = local_578._0_4_;
                }
              }
              p_Var8 = local_500._M_buckets
                       [(ulong)(long)(int)local_578._0_4_ % local_500._M_bucket_count];
              p_Var16 = (__node_base_ptr)0x0;
              if ((p_Var8 != (__node_base_ptr)0x0) &&
                 (p_Var16 = p_Var8, p_Var23 = p_Var8->_M_nxt,
                 local_578._0_4_ != *(int *)&p_Var8->_M_nxt[1]._M_nxt)) {
                while (p_Var17 = p_Var23->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
                  p_Var16 = (__node_base_ptr)0x0;
                  if (((ulong)(long)*(int *)&p_Var17[1]._M_nxt % local_500._M_bucket_count !=
                       (ulong)(long)(int)local_578._0_4_ % local_500._M_bucket_count) ||
                     (p_Var16 = p_Var23, p_Var23 = p_Var17,
                     local_578._0_4_ == *(int *)&p_Var17[1]._M_nxt)) goto LAB_002d5f8c;
                }
                p_Var16 = (__node_base_ptr)0x0;
              }
LAB_002d5f8c:
              if (p_Var16 == (__node_base_ptr)0x0) {
                p_Var17 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var17 = p_Var16->_M_nxt;
              }
              if (p_Var17 != (_Hash_node_base *)0x0) {
                LogError<true,char[10],int,char[24],std::__cxx11::string,char[37],char_const*,char[69]>
                          (false,"operator()",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                           ,0xbe7,(char (*) [10])"Location ",(int *)local_578,
                           (char (*) [24])" assigned to semantic \"",pSVar1,
                           (char (*) [37])"\" conflicts with previous semantic \"",
                           (char **)(p_Var17 + 2),
                           (char (*) [69])
                           "\". Please use ATTRIB* semantic to explicitly specify attribute index");
              }
              pcVar9 = (pSVar1->_M_dataplus)._M_p;
              pCVar20 = (ConversionStream *)local_578;
              ppcVar18 = std::__detail::
                         _Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_500,(key_type *)pCVar20);
              *ppcVar18 = pcVar9;
              pSVar1 = (String *)(local_578 + 8);
              BuildParameterName_abi_cxx11_(pSVar1,pCVar20,&local_5b8,'_',"_vsin_","","");
              DefineInterfaceVar(local_578._0_4_,(char *)0x0,"in",&pSVar4->Type,pSVar1,
                                 (stringstream *)local_340);
              InitVariable((string *)local_5d8,pSVar1,(stringstream *)local_4c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_578._8_8_ != &local_560) {
                operator_delete((void *)local_578._8_8_,local_560._M_allocated_capacity + 1);
              }
              local_578._4_4_ = local_578._4_4_ + 1;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"    ",4);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4b8,local_548,(long)local_540._M_nxt);
              local_578[8] = 0x28;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_578 + 8,1);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_5d8._0_8_,local_5d8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,");\n",3);
            }
            if ((pointer)local_5d8._0_8_ != (pointer)(local_5d8 + 0x10)) {
              operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
            }
            local_5b8.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_5b8.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            iStack_590._M_current = iStack_590._M_current + -1;
            if (local_548 != &local_538) {
              operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
            }
          }
          else {
            if ((pSVar4->Semantic)._M_string_length != 0) {
              LogError<true,char[35],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar4->Name,
                         (char (*) [2])0x70aecf);
            }
            pSVar5 = iStack_590._M_current[-1]._M_current;
            if (pSVar5 == (pSVar4->members).
                          super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              local_5b8.
              super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_5b8.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              iStack_590._M_current = iStack_590._M_current + -1;
            }
            else {
              iStack_590._M_current[-1]._M_current = pSVar5 + 1;
              if (local_5b8.
                  super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_5b8.
                  super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_5d8._0_8_ = pSVar5;
                std::
                vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                ::
                _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                          ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                            *)&local_5b8,
                           (iterator)
                           local_5b8.
                           super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (ShaderParameterInfo **)local_5d8);
              }
              else {
                *local_5b8.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = pSVar5;
                local_5b8.
                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_5b8.
                     super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              local_5d8._0_8_ =
                   (pSVar5->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (iStack_590._M_current == local_588) {
                std::
                vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                ::
                _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                          ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                            *)&local_598,iStack_590,
                           (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                            *)local_5d8);
              }
              else {
                (iStack_590._M_current)->_M_current = (ShaderParameterInfo *)local_5d8._0_8_;
                iStack_590._M_current = iStack_590._M_current + 1;
              }
            }
          }
        }
        goto LAB_002d60fd;
      }
      pSVar24 = pSVar24 + 1;
    } while (pSVar24 != (pointer)local_508._M_nxt);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            (local_330,(char *)local_5d8._0_8_,local_5d8._8_8_);
  pSVar24 = (pointer)(local_5d8 + 0x10);
  if ((pointer)local_5d8._0_8_ != pSVar24) {
    operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_510,(string *)local_5d8);
  if ((pointer)local_5d8._0_8_ != pSVar24) {
    operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_518,(string *)local_5d8);
  if ((pointer)local_5d8._0_8_ != pSVar24) {
    operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_500);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base(aiStack_448);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessVertexShaderArguments(std::vector<ShaderParameterInfo>& Params,
                                                                            String&                           GlobalVariables,
                                                                            std::stringstream&                ReturnHandlerSS,
                                                                            String&                           Prologue)
{
    stringstream GlobalVarsSS, PrologueSS, InterfaceVarsSS;
    int          OutLocation       = 0;
    int          AutoInputLocation = 0; // Automatically assigned input location

    std::unordered_map<int, const Char*> LocationToSemantic;
    for (const auto& Param : Params)
    {
        if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            ProcessShaderArgument(
                Param, VSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                {
                    String FullParamName = BuildParameterName(MemberStack, '.');
                    if (!Getter.empty())
                        PrologueSS << "    " << Getter << '(' << FullParamName << ");\n";
                    else
                    {
                        int         InputLocation  = AutoInputLocation;
                        const auto& Semantic       = Param.Semantic;
                        auto        SemanticEndPos = Semantic.begin();
                        if (Parsing::SkipString(SemanticEndPos, Semantic.end(), "attrib", SemanticEndPos))
                        {
                            char* EndPtr    = nullptr;
                            auto  AttribInd = static_cast<int>(strtol(&*SemanticEndPos, &EndPtr, 10));
                            if (EndPtr != nullptr && *EndPtr == 0)
                            {
                                InputLocation     = AttribInd;
                                AutoInputLocation = InputLocation;
                            }
                        }
                        auto it = LocationToSemantic.find(InputLocation);
                        if (it != LocationToSemantic.end())
                        {
                            LOG_ERROR_AND_THROW("Location ", InputLocation, " assigned to semantic \"", Semantic, "\" conflicts with previous semantic \"", it->second, "\". Please use ATTRIB* semantic to explicitly specify attribute index");
                        }
                        LocationToSemantic[InputLocation] = Semantic.c_str();
                        auto InputVarName                 = BuildParameterName(MemberStack, '_', "_vsin_");
                        // Interpolation qualifiers are not allowed on VS inputs.
                        const char* Interpolation = nullptr;
                        // Layout location qualifiers are allowed on VS inputs even in GLES3.0.
                        DefineInterfaceVar(InputLocation, Interpolation, "in", Param.Type, InputVarName, GlobalVarsSS);
                        InitVariable(FullParamName, InputVarName, PrologueSS);
                        AutoInputLocation++;
                    }
                } //
            );
        }
        else if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Out ||
                 Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret)
        {
            ProcessShaderArgument(
                Param, VSInd, OutVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Setter) //
                {
                    String FullParamName = BuildParameterName(MemberStack, '.', "", Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Ret ? "_RET_VAL_" : "");
                    if (!Setter.empty())
                        ReturnHandlerSS << Setter << '(' << FullParamName << ");\\\n";
                    else
                    {
                        auto OutputVarName = BuildParameterName(MemberStack, '_', m_bUseInOutLocationQualifiers ? "_vsout_" : "_");
                        DefineInterfaceVar(m_bUseInOutLocationQualifiers ? OutLocation++ : -1,
                                           GetInterpolationQualifier(Param), "out",
                                           Param.Type, OutputVarName, InterfaceVarsSS);
                        ReturnHandlerSS << OutputVarName << " = " << FullParamName << ";\\\n";
                    }
                } //
            );
        }
    }

    GlobalVarsSS << InterfaceVarsSS.str();
    GlobalVariables = GlobalVarsSS.str();
    Prologue        = PrologueSS.str();
}